

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O3

DeviceAPI * __thiscall
tvm::runtime::DeviceAPIManager::GetAPI(DeviceAPIManager *this,int type,bool allow_missing)

{
  uint uVar1;
  DeviceAPI *pDVar2;
  char *__s;
  string local_1f0;
  string local_1d0;
  LogMessageFatal local_1b0;
  
  if (type < 0x80) {
    pDVar2 = (this->api_)._M_elems[type];
    if (pDVar2 == (DeviceAPI *)0x0) {
      uVar1 = type - 1;
      if ((uVar1 < 0xc) && ((0xffbU >> (uVar1 & 0x1f) & 1) != 0)) {
        __s = &DAT_00138d1c + *(int *)(&DAT_00138d1c + (ulong)uVar1 * 4);
      }
      else {
        dmlc::LogMessageFatal::LogMessageFatal
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/device_api.h"
                   ,0xe6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"unknown type =",0xe);
        std::ostream::operator<<(&local_1b0,type);
        dmlc::LogMessageFatal::~LogMessageFatal(&local_1b0);
        __s = "Unknown";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,__s,(allocator<char> *)&local_1b0);
      pDVar2 = GetAPI(this,&local_1d0,allow_missing);
      (this->api_)._M_elems[type] = pDVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        pDVar2 = (this->api_)._M_elems[type];
      }
    }
  }
  else {
    pDVar2 = this->rpc_api_;
    if (pDVar2 == (DeviceAPI *)0x0) {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"rpc","");
      pDVar2 = GetAPI(this,&local_1f0,allow_missing);
      this->rpc_api_ = pDVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        pDVar2 = this->rpc_api_;
      }
    }
  }
  return pDVar2;
}

Assistant:

DeviceAPI *GetAPI(int type, bool allow_missing) {
    if (type < kRPCSessMask) {
      if (api_[type] != nullptr)
        return api_[type];
      /* [RISCV-DLR] multi-threading is not supported, so lock is unnecessary */
      //std::lock_guard<std::mutex> lock(mutex_);
      if (api_[type] != nullptr)
        return api_[type];
      api_[type] = GetAPI(DeviceName(type), allow_missing);
      return api_[type];
    } else {
      if (rpc_api_ != nullptr)
        return rpc_api_;
      /* [RISCV-DLR] multi-threading is not supported, so lock is unnecessary */
      //std::lock_guard<std::mutex> lock(mutex_);
      if (rpc_api_ != nullptr)
        return rpc_api_;
      rpc_api_ = GetAPI("rpc", allow_missing);
      return rpc_api_;
    }
  }